

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O0

void __thiscall SSM::ECUPort::ECUPort(ECUPort *this,string *device_file_path)

{
  int iVar1;
  char *pcVar2;
  DeviceException *this_00;
  int *piVar3;
  allocator<std::byte> local_99;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_98
  ;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_90
  ;
  vector<std::byte,_std::allocator<std::byte>_> local_88;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_70
  ;
  const_iterator it;
  allocator<char> local_49;
  string local_48;
  string *local_18;
  string *device_file_path_local;
  ECUPort *this_local;
  
  local_18 = device_file_path;
  device_file_path_local = (string *)this;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&this->m_ecu_id);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&this->m_init_response);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar2,2);
  this->m_file = iVar1;
  if (this->m_file < 0) {
    this_00 = (DeviceException *)__cxa_allocate_exception(0x28);
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar2,&local_49);
    DeviceException::DeviceException(this_00,&local_48);
    __cxa_throw(this_00,&DeviceException::typeinfo,DeviceException::~DeviceException);
  }
  configurePort(&this->m_file);
  ECUInit((Bytes *)&it,this);
  std::vector<std::byte,_std::allocator<std::byte>_>::operator=
            (&this->m_init_response,(vector<std::byte,_std::allocator<std::byte>_> *)&it);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&it);
  local_90._M_current = (byte *)skipToData(&this->m_init_response);
  local_70._M_current = local_90._M_current;
  local_98 = __gnu_cxx::
             __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
             ::operator+(&local_70,5);
  std::allocator<std::byte>::allocator(&local_99);
  std::vector<std::byte,std::allocator<std::byte>>::
  vector<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>,void>
            ((vector<std::byte,std::allocator<std::byte>> *)&local_88,local_90,local_98,&local_99);
  std::vector<std::byte,_std::allocator<std::byte>_>::operator=(&this->m_ecu_id,&local_88);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_88);
  std::allocator<std::byte>::~allocator(&local_99);
  return;
}

Assistant:

ECUPort::ECUPort(const std::string& device_file_path)
  {
    // Open device file
    m_file = open(device_file_path.c_str(), O_RDWR);
    if (m_file<0) throw(DeviceException(strerror(errno)));

    // Configure port
    configurePort(m_file);

    // Initialize communication with ECU
    m_init_response = ECUInit();

    // The ECU identifier is part of the response. 
    Bytes::const_iterator it = skipToData(m_init_response);
    m_ecu_id = Bytes(it, it+5);
  }